

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::core::Transaction::AddTxIn
          (Transaction *this,Txid *txid,uint32_t index,uint32_t sequence,Script *unlocking_script)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  CfdException *this_00;
  TxIn txin;
  AbstractTxIn local_b8;
  
  if ((long)(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
            _M_impl.super__Vector_impl_data._M_start != 0x8fffffff70) {
    AbstractTransaction::AddTxIn
              (&this->super_AbstractTransaction,txid,index,sequence,unlocking_script);
    TxIn::TxIn(&txin,txid,index,sequence);
    bVar3 = Script::IsEmpty(unlocking_script);
    if (!bVar3) {
      TxIn::TxIn((TxIn *)&local_b8,txid,index,sequence,unlocking_script);
      AbstractTxIn::operator=(&txin.super_AbstractTxIn,&local_b8);
      AbstractTxIn::~AbstractTxIn(&local_b8);
    }
    ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::push_back(&this->vin_,&txin);
    (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,1);
    pTVar1 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pTVar2 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
             _M_impl.super__Vector_impl_data._M_start;
    AbstractTxIn::~AbstractTxIn(&txin.super_AbstractTxIn);
    return (int)(((long)pTVar1 - (long)pTVar2) / 0x90) - 1;
  }
  txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x4b0ffe;
  txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x234;
  txin.super_AbstractTxIn.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "AddTxIn";
  logger::warn<>((CfdSourceLocation *)&txin,"vin maximum.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&txin,"txin maximum.",(allocator *)&local_b8);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&txin);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Transaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  AbstractTransaction::AddTxIn(txid, index, sequence, unlocking_script);
  TxIn txin(txid, index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = TxIn(txid, index, sequence, unlocking_script);
  }

  vin_.push_back(txin);

  CallbackStateChange(kStateChangeAddTxIn);
  return static_cast<uint32_t>(vin_.size() - 1);
}